

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O2

char * decode_uint32(uint32_t *i,char *p)

{
  *i = *(uint32_t *)p;
  return p + 4;
}

Assistant:

const char *decode_uint32(uint32_t *i, const char *p) {
    if (is_little_endian()) {
        *i = ((uint32_t *) p)[0];
    } else {
        char *ptr = (char *) i;
        ptr[0] = p[3];
        ptr[1] = p[2];
        ptr[2] = p[1];
        ptr[3] = p[0];
    }
    return p + 4;
}